

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

QSize __thiscall QMenu::sizeHint(QMenu *this)

{
  long lVar1;
  QMenuPrivate *this_00;
  QRect *pQVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QStyle *pQVar7;
  QSize QVar8;
  int i;
  ulong uVar9;
  int iVar10;
  long lVar11;
  long in_FS_OFFSET;
  int local_80;
  int local_7c;
  QStyleOption opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMenuPrivate **)&(this->super_QWidget).field_0x8;
  QMenuPrivate::updateActionRects(this_00);
  iVar6 = -1;
  lVar11 = 0;
  uVar9 = 0;
  iVar10 = -1;
  while( true ) {
    if ((ulong)(this_00->actionRects).d.size <= uVar9) break;
    pQVar2 = (this_00->actionRects).d.ptr;
    bVar3 = QRect::isNull((QRect *)((long)&(pQVar2->x1).m_i + lVar11));
    if (!bVar3) {
      iVar4 = *(int *)((long)&(pQVar2->y2).m_i + lVar11);
      if (iVar10 <= iVar4) {
        local_7c = iVar4 + 1;
        iVar10 = local_7c;
      }
      iVar4 = *(int *)((long)&(pQVar2->x2).m_i + lVar11);
      if (iVar6 <= iVar4) {
        local_80 = iVar4 + 1;
        iVar6 = local_80;
      }
    }
    uVar9 = uVar9 + 1;
    lVar11 = lVar11 + 0x10;
  }
  opt.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  opt._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOption::QStyleOption(&opt,0,0);
  QStyleOption::initFrom(&opt,&this->super_QWidget);
  pQVar7 = QWidget::style(&this->super_QWidget);
  iVar4 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x1e,&opt,this);
  pQVar7 = QWidget::style(&this->super_QWidget);
  iVar5 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x1c,&opt,this);
  local_80 = (this_00->super_QWidgetPrivate).rightmargin + iVar6 + iVar5 + iVar4;
  pQVar7 = QWidget::style(&this->super_QWidget);
  iVar6 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x1d,&opt,this);
  local_7c = (this_00->super_QWidgetPrivate).bottommargin + iVar10 + iVar6 + iVar4;
  pQVar7 = QWidget::style(&this->super_QWidget);
  QVar8 = (QSize)(**(code **)(*(long *)pQVar7 + 0xe8))(pQVar7,10,&opt,&local_80,this);
  QStyleOption::~QStyleOption(&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar8;
  }
  __stack_chk_fail();
}

Assistant:

QSize QMenu::sizeHint() const
{
    Q_D(const QMenu);
    d->updateActionRects();

    QSize s;
    for (int i = 0; i < d->actionRects.size(); ++i) {
        const QRect &rect = d->actionRects.at(i);
        if (rect.isNull())
            continue;
        if (rect.bottom() >= s.height())
            s.setHeight(rect.y() + rect.height());
        if (rect.right() >= s.width())
            s.setWidth(rect.x() + rect.width());
    }
    // Note that the action rects calculated above already include
    // the top and left margins, so we only need to add margins for
    // the bottom and right.
    QStyleOption opt(0);
    opt.initFrom(this);
    const int fw = style()->pixelMetric(QStyle::PM_MenuPanelWidth, &opt, this);
    s.rwidth() += style()->pixelMetric(QStyle::PM_MenuHMargin, &opt, this) + fw + d->rightmargin;
    s.rheight() += style()->pixelMetric(QStyle::PM_MenuVMargin, &opt, this) + fw + d->bottommargin;

    return style()->sizeFromContents(QStyle::CT_Menu, &opt, s, this);
}